

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

int EncodeData(BrotliEncoderStateInternal *s,int is_last,int force_flush,size_t *out_size,
              uint8_t **output)

{
  BrotliHasherParams *pBVar1;
  MemoryManager *m;
  Hasher *hasher;
  anon_union_1056_13_a959428b_for_privat *self;
  size_t *last_insert_len;
  size_t *num_literals;
  uint uVar2;
  undefined4 uVar3;
  uint8_t *data;
  undefined4 uVar9;
  HasherCommon *pHVar4;
  uint16_t *puVar5;
  void *pvVar6;
  uint64_t uVar7;
  uint8_t *puVar8;
  undefined3 uVar10;
  int iVar11;
  undefined8 uVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  ushort uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  int iVar19;
  size_t i;
  uint32_t *puVar20;
  uint8_t *puVar21;
  int *piVar22;
  ulong uVar23;
  Command *pCVar24;
  void *pvVar25;
  ulong *puVar26;
  uint8_t *puVar27;
  ulong uVar28;
  uint *puVar29;
  byte bVar30;
  char cVar31;
  uint uVar32;
  long lVar33;
  BrotliEncoderParams *extraout_RDX;
  BrotliEncoderParams *extraout_RDX_00;
  BrotliEncoderParams *pBVar34;
  BrotliEncoderParams *extraout_RDX_01;
  BrotliEncoderParams *params;
  BrotliEncoderParams *extraout_RDX_02;
  size_t __n;
  ulong uVar35;
  ContextLut literal_context_lut;
  ulong uVar36;
  BrotliEncoderStateInternal *s_00;
  BrotliEncoderStateInternal *pBVar37;
  size_t sVar38;
  Hasher *pHVar39;
  uint32_t *puVar40;
  uint32_t *puVar41;
  size_t *psVar42;
  uint32_t **ppuVar43;
  HasherCommon *pHVar44;
  int *piVar45;
  uint16_t uVar46;
  uint uVar47;
  uint uVar48;
  byte bVar49;
  size_t sVar50;
  size_t sVar51;
  ulong *puVar52;
  int iVar53;
  uint64_t uVar54;
  uint *puVar55;
  uint uVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  ulong mask;
  bool bVar60;
  bool bVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar72;
  uint8_t *local_b40;
  ulong local_b38;
  double local_b30;
  uint32_t *local_af8;
  ulong local_ad8;
  size_t storage_ix_1;
  uint32_t *local_ac8;
  undefined8 uStack_ac0;
  uint32_t *local_ab8;
  int *local_ab0;
  double local_aa8;
  double dStack_aa0;
  uint8_t *local_a98;
  undefined8 uStack_a90;
  ulong local_a80;
  ulong local_a78;
  Command *local_a70;
  ulong local_a68;
  BrotliEncoderStateInternal *local_a60;
  uint32_t *combined_histo;
  uint8_t *local_a50;
  ulong local_a48;
  ulong local_a40;
  size_t local_a38;
  uint local_a2c;
  uint32_t monogram_histo [3];
  uint local_a1c;
  int *local_a18;
  uint8_t *local_a10;
  uint8_t *local_a08;
  int local_9fc;
  uint local_9f8 [8];
  size_t end_pos;
  ulong local_9d0;
  uint8_t **local_9c8;
  double local_9c0;
  size_t storage_ix;
  BrotliEncoderParams *pBStack_9b0;
  size_t local_9a8;
  size_t sStack_9a0;
  uint32_t local_974;
  size_t table_size;
  BlockSplit local_408;
  BlockSplit local_3d8;
  uint32_t *local_3a8;
  size_t sStack_3a0;
  uint32_t *local_398;
  size_t sStack_390;
  HistogramLiteral *local_388;
  size_t sStack_380;
  HistogramCommand *local_378;
  size_t sStack_370;
  HistogramDistance *local_368;
  size_t sStack_360;
  
  bVar30 = 0;
  uVar35 = (ulong)(uint)is_last;
  uVar54 = s->input_pos_;
  dVar72 = (double)s->last_processed_pos_;
  uVar17 = WrapPosition((uint64_t)dVar72);
  local_b40 = (uint8_t *)(ulong)uVar17;
  uVar48 = (s->params).quality;
  params = (BrotliEncoderParams *)(ulong)uVar48;
  data = (s->ringbuffer_).buffer_;
  uVar2 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar2;
  local_b38 = uVar54 - (long)dVar72;
  if (local_b38 == 0) {
    if (data == (uint8_t *)0x0) {
      if (is_last != 0) {
        uVar16 = (ushort)(3 << (s->last_bytes_bits_ & 0x1f)) | s->last_bytes_;
        s->last_bytes_ = uVar16;
        bVar30 = s->last_bytes_bits_ + 2;
        s->last_bytes_bits_ = bVar30;
        (s->tiny_buf_).u8[0] = (uint8_t)uVar16;
        (s->tiny_buf_).u8[1] = (uint8_t)(uVar16 >> 8);
        *output = (uint8_t *)&s->tiny_buf_;
        *out_size = (ulong)(bVar30 + 7 >> 3);
        return 1;
      }
      goto LAB_00dfcbfe;
    }
    if ((is_last == 0) && (force_flush == 0 || uVar48 < 2)) goto LAB_00dfcbfe;
  }
  if ((s->params).dictionary.max_quality < (int)uVar48) {
    return 0;
  }
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  local_a38 = 1;
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < local_b38) {
    return 0;
  }
  local_9c8 = output;
  local_ab0 = (int *)uVar54;
  local_aa8 = dVar72;
  if (uVar48 == 0) {
LAB_00dface7:
    storage_ix = (size_t)s->last_bytes_bits_;
    puVar21 = GetBrotliStorage(s,(ulong)((int)local_b38 * 2 + 0x1f7));
    *puVar21 = (uint8_t)s->last_bytes_;
    puVar21[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
    local_b38 = local_b38 & 0xffffffff;
    piVar22 = GetHashTable(s,(s->params).quality,local_b38,&table_size);
    if ((s->params).quality == 0) {
      duckdb_brotli::BrotliCompressFragmentFast
                (s->one_pass_arena_,data + (uVar2 & uVar17),local_b38,is_last,piVar22,table_size,
                 &storage_ix,puVar21);
    }
    else {
      duckdb_brotli::BrotliCompressFragmentTwoPass
                (s->two_pass_arena_,data + (uVar2 & uVar17),local_b38,is_last,s->command_buf_,
                 s->literal_buf_,piVar22,table_size,&storage_ix,puVar21);
    }
    uVar35 = storage_ix >> 3;
    s->last_bytes_ = (ushort)puVar21[uVar35];
    s->last_bytes_bits_ = (byte)storage_ix & 7;
    UpdateLastProcessedPos(s);
    *local_9c8 = puVar21;
    *out_size = uVar35;
    return 1;
  }
  m = &s->memory_manager_;
  if (uVar48 == 1) {
    if (s->command_buf_ == (uint32_t *)0x0) {
      puVar20 = (uint32_t *)duckdb_brotli::BrotliAllocate(m,0x80000);
      s->command_buf_ = puVar20;
      puVar21 = (uint8_t *)duckdb_brotli::BrotliAllocate(m,0x20000);
      s->literal_buf_ = puVar21;
    }
    goto LAB_00dface7;
  }
  uVar23 = s->num_commands_ + (local_b38 >> 1 & 0x7fffffff) + 1;
  local_a78 = uVar35;
  if (s->cmd_alloc_size_ < uVar23) {
    sVar38 = (local_b38 >> 2 & 0x3fffffff) + uVar23 + 0x10;
    s->cmd_alloc_size_ = sVar38;
    if (sVar38 == 0) {
      pCVar24 = (Command *)0x0;
    }
    else {
      pCVar24 = (Command *)duckdb_brotli::BrotliAllocate(m,sVar38 * 0x10);
      params = extraout_RDX;
    }
    if (s->commands_ != (Command *)0x0) {
      switchD_00916250::default(pCVar24,s->commands_,s->num_commands_ << 4);
      duckdb_brotli::BrotliFree(m,s->commands_);
      params = extraout_RDX_00;
    }
    s->commands_ = pCVar24;
  }
  hasher = &s->hasher_;
  puVar20 = (uint32_t *)(local_b38 & 0xffffffff);
  bVar60 = uVar17 == 0;
  bVar61 = (int)local_a78 != 0;
  uVar48 = (uint)(bVar61 && bVar60);
  if ((s->hasher_).common.is_setup_ != 0) {
    local_a18 = &(s->hasher_).common.is_prepared_;
    if ((s->hasher_).common.is_prepared_ == 0) goto LAB_00dfb4da;
    goto LAB_00dfba97;
  }
  local_9a8 = 0;
  sStack_9a0 = 0;
  storage_ix = 0;
  pBStack_9b0 = (BrotliEncoderParams *)0x0;
  pBVar1 = &(s->params).hasher;
  uVar32 = (s->params).quality;
  pBVar34 = (BrotliEncoderParams *)(ulong)uVar32;
  if ((int)uVar32 < 10) {
    if (uVar32 == 4) {
      if ((s->params).size_hint < 0x100000) {
LAB_00dfafa8:
        pBVar1->type = uVar32;
      }
      else {
        pBVar1->type = 0x36;
        pBVar34 = (BrotliEncoderParams *)0x36;
      }
    }
    else {
      if ((int)uVar32 < 5) goto LAB_00dfafa8;
      uVar56 = (s->params).lgwin;
      if ((int)uVar56 < 0x11) {
        pBVar34 = (BrotliEncoderParams *)0x28;
        if (6 < uVar32) {
          pBVar34 = (BrotliEncoderParams *)(ulong)(0x2a - (uVar32 < 9));
        }
        pBVar1->type = (int)pBVar34;
      }
      else if ((uVar56 < 0x13) || ((s->params).size_hint < 0x100000)) {
        iVar19 = 0x10;
        if (uVar32 < 9) {
          iVar19 = 10;
        }
        (s->params).hasher.type = 5;
        (s->params).hasher.block_bits = uVar32 - 1;
        (s->params).hasher.bucket_bits = 0xf - (uint)(uVar32 < 7);
        if (uVar32 < 7) {
          iVar19 = 4;
        }
        (s->params).hasher.num_last_distances_to_check = iVar19;
        pBVar34 = (BrotliEncoderParams *)0x5;
      }
      else {
        (s->params).hasher.type = 6;
        (s->params).hasher.bucket_bits = 0xf;
        (s->params).hasher.block_bits = uVar32 - 1;
        iVar19 = 0x10;
        if (uVar32 < 9) {
          iVar19 = 10;
        }
        if (uVar32 < 7) {
          iVar19 = 4;
        }
        (s->params).hasher.num_last_distances_to_check = iVar19;
        pBVar34 = (BrotliEncoderParams *)0x6;
      }
    }
  }
  else {
    pBVar1->type = 10;
    pBVar34 = (BrotliEncoderParams *)0xa;
  }
  iVar19 = (s->params).lgwin;
  iVar53 = (int)pBVar34;
  if (iVar19 < 0x19) {
LAB_00dfb090:
    iVar11 = pBVar1->bucket_bits;
    iVar14 = (s->params).hasher.block_bits;
    iVar15 = (s->params).hasher.num_last_distances_to_check;
    (s->hasher_).common.params.type = pBVar1->type;
    (s->hasher_).common.params.bucket_bits = iVar11;
    (s->hasher_).common.params.block_bits = iVar14;
    (s->hasher_).common.params.num_last_distances_to_check = iVar15;
    (s->hasher_).common.dict_num_lookups = 0;
    (s->hasher_).common.dict_num_matches = 0;
    params = (BrotliEncoderParams *)&switchD_00dfb0c5::switchdataD_010844f8;
    switch(iVar53) {
    case 2:
    case 3:
      storage_ix = 0x40000;
      break;
    case 4:
      storage_ix = 0x80000;
      break;
    case 5:
    case 6:
      bVar49 = (byte)(s->params).hasher.bucket_bits;
      storage_ix = 2L << (bVar49 & 0x3f);
      pBStack_9b0 = (BrotliEncoderParams *)
                    ((4L << (bVar49 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f));
      params = pBStack_9b0;
      break;
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      puVar41 = (uint32_t *)(1L << ((byte)iVar19 & 0x3f));
      puVar40 = puVar20;
      if (puVar41 < puVar20) {
        puVar40 = puVar41;
      }
      if (uVar48 == 0) {
        puVar40 = puVar41;
      }
      storage_ix = 0x80000;
      pBStack_9b0 = (BrotliEncoderParams *)((long)puVar40 << 3);
      break;
    default:
      params = pBVar34;
      switch(iVar53) {
      case 0x23:
switchD_00dfb0f2_caseD_23:
        storage_ix = 0x40000;
        goto LAB_00dfb1a0;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        storage_ix = 0x40000;
        pBStack_9b0 = (BrotliEncoderParams *)0x40000;
        break;
      case 0x2a:
        storage_ix = 0x40000;
        pBStack_9b0 = (BrotliEncoderParams *)
                      &std::
                       __relocate_a_1<duckdb::Value_*,_duckdb::Value_*,_std::allocator<duckdb::Value>_>
        ;
        break;
      default:
        if (iVar53 == 0x36) {
          storage_ix = 0x400000;
        }
      }
    }
  }
  else {
    if (iVar53 == 0x36) {
      (s->params).hasher.type = 0x37;
      iVar19 = pBVar1->bucket_bits;
      iVar53 = (s->params).hasher.block_bits;
      iVar11 = (s->params).hasher.num_last_distances_to_check;
      (s->hasher_).common.params.type = pBVar1->type;
      (s->hasher_).common.params.bucket_bits = iVar19;
      (s->hasher_).common.params.block_bits = iVar53;
      (s->hasher_).common.params.num_last_distances_to_check = iVar11;
      (s->hasher_).common.dict_num_lookups = 0;
      (s->hasher_).common.dict_num_matches = 0;
      storage_ix = 0x400000;
LAB_00dfb1a0:
      pBStack_9b0 = (BrotliEncoderParams *)0x0;
    }
    else {
      if (iVar53 != 6) {
        if (iVar53 != 3) goto LAB_00dfb090;
        (s->params).hasher.type = 0x23;
        iVar19 = pBVar1->bucket_bits;
        iVar53 = (s->params).hasher.block_bits;
        iVar11 = (s->params).hasher.num_last_distances_to_check;
        (s->hasher_).common.params.type = pBVar1->type;
        (s->hasher_).common.params.bucket_bits = iVar19;
        (s->hasher_).common.params.block_bits = iVar53;
        (s->hasher_).common.params.num_last_distances_to_check = iVar11;
        (s->hasher_).common.dict_num_lookups = 0;
        (s->hasher_).common.dict_num_matches = 0;
        goto switchD_00dfb0f2_caseD_23;
      }
      (s->params).hasher.type = 0x41;
      iVar19 = pBVar1->bucket_bits;
      iVar53 = (s->params).hasher.block_bits;
      iVar11 = (s->params).hasher.num_last_distances_to_check;
      (s->hasher_).common.params.type = pBVar1->type;
      (s->hasher_).common.params.bucket_bits = iVar19;
      (s->hasher_).common.params.block_bits = iVar53;
      (s->hasher_).common.params.num_last_distances_to_check = iVar11;
      (s->hasher_).common.dict_num_lookups = 0;
      (s->hasher_).common.dict_num_matches = 0;
      bVar49 = (byte)(s->params).hasher.bucket_bits;
      pBVar34 = (BrotliEncoderParams *)(2L << (bVar49 & 0x3f));
      storage_ix = (size_t)pBVar34;
      pBStack_9b0 = (BrotliEncoderParams *)
                    ((4L << (bVar49 & 0x3f)) << ((byte)(s->params).hasher.block_bits & 0x3f));
    }
    local_9a8 = 0x4000000;
    sStack_9a0 = 0;
    params = pBVar34;
  }
  sStack_9a0 = 0;
  local_ac8 = puVar20;
  for (lVar33 = 0; puVar20 = local_ac8, lVar33 != 4; lVar33 = lVar33 + 1) {
    if ((&storage_ix)[lVar33] != 0) {
      pvVar25 = duckdb_brotli::BrotliAllocate(m,(&storage_ix)[lVar33]);
      (s->hasher_).common.extra[lVar33] = pvVar25;
      params = extraout_RDX_01;
    }
  }
  iVar19 = (s->hasher_).common.params.type;
  switch(iVar19) {
  case 2:
  case 3:
  case 4:
switchD_00dfb30f_caseD_2:
    (s->hasher_).privat._H2.common = &hasher->common;
    puVar40 = (uint32_t *)(s->hasher_).common.extra[0];
LAB_00dfb3de:
    (s->hasher_).privat._H2.buckets_ = puVar40;
    break;
  case 5:
    (s->hasher_).privat._H5.common_ = &hasher->common;
    iVar19 = (s->hasher_).common.params.bucket_bits;
    (s->hasher_).privat._H5.hash_shift_ = 0x20 - iVar19;
    params = (BrotliEncoderParams *)(1L << ((byte)iVar19 & 0x3f));
    (s->hasher_).privat._H2.common = (HasherCommon *)params;
    puVar40 = (uint32_t *)(s->hasher_).common.extra[1];
    (s->hasher_).privat._H5.num_ = (uint16_t *)(s->hasher_).common.extra[0];
    (s->hasher_).privat._H5.buckets_ = puVar40;
    uVar3 = (s->hasher_).common.params.block_bits;
    uVar9 = (s->hasher_).common.params.num_last_distances_to_check;
    sVar38 = 1L << ((byte)uVar3 & 0x3f);
    (s->hasher_).privat._H5.block_size_ = sVar38;
    (s->hasher_).privat._H5.block_mask_ = (int)sVar38 - 1;
    *(undefined4 *)((long)&(s->hasher_).privat + 0x18) = uVar3;
    *(undefined4 *)((long)&(s->hasher_).privat + 0x1c) = uVar9;
    break;
  case 6:
    duckdb_brotli::InitializeH6(&hasher->common,&(s->hasher_).privat._H6,params);
    params = extraout_RDX_02;
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    (s->hasher_).privat._H2.buckets_ = (uint32_t *)(s->hasher_).common.extra[0];
    (s->hasher_).privat._H40.extra[1] = (s->hasher_).common.extra[1];
    uVar32 = -1 << ((byte)(s->params).lgwin & 0x1f);
    *(ulong *)&(s->hasher_).privat = (ulong)~uVar32;
    (s->hasher_).privat._H5.hash_shift_ = uVar32 + 1;
    break;
  default:
    switch(iVar19) {
    case 0x23:
switchD_00dfb2be_caseD_23:
      (s->hasher_).privat._H35.common = &hasher->common;
      lVar33 = 10;
      pHVar39 = hasher;
      ppuVar43 = &(s->hasher_).privat._H6.buckets_;
      for (lVar59 = lVar33; lVar59 != 0; lVar59 = lVar59 + -1) {
        *ppuVar43 = (uint32_t *)(pHVar39->common).extra[0];
        pHVar39 = (Hasher *)((long)pHVar39 + (ulong)bVar30 * -0x10 + 8);
        ppuVar43 = ppuVar43 + (ulong)bVar30 * -2 + 1;
      }
      pHVar39 = hasher;
      pHVar44 = &(s->hasher_).privat._H35.hb_common;
      for (; lVar33 != 0; lVar33 = lVar33 + -1) {
        pHVar44->extra[0] = (pHVar39->common).extra[0];
        pHVar39 = (Hasher *)((long)pHVar39 + (ulong)bVar30 * -0x10 + 8);
        pHVar44 = (HasherCommon *)((long)pHVar44 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      (s->hasher_).privat._H35.fresh = 1;
      (s->hasher_).privat._H35.params = &s->params;
      params = (BrotliEncoderParams *)hasher;
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      (s->hasher_).privat._H5.common_ = &hasher->common;
      pvVar25 = (s->hasher_).common.extra[1];
      (s->hasher_).privat._H6.hash_mul_ = (uint64_t)(s->hasher_).common.extra[0];
      (s->hasher_).privat._H40.extra[1] = pvVar25;
      iVar19 = (s->params).quality;
      puVar40 = (uint32_t *)(ulong)((iVar19 < 7) + 7 << ((char)iVar19 - 4U & 0x1f));
      goto LAB_00dfb3de;
    case 0x2a:
      (s->hasher_).privat._H42.common = &hasher->common;
      pvVar25 = (s->hasher_).common.extra[1];
      (s->hasher_).privat._H42.extra[0] = (s->hasher_).common.extra[0];
      (s->hasher_).privat._H42.extra[1] = pvVar25;
      iVar19 = (s->params).quality;
      *(ulong *)((long)&(s->hasher_).privat + 0x400) =
           (ulong)((iVar19 < 7) + 7 << ((char)iVar19 - 4U & 0x1f));
      break;
    default:
      if (iVar19 == 0x36) goto switchD_00dfb30f_caseD_2;
      if (iVar19 == 0x37) goto switchD_00dfb2be_caseD_23;
      if (iVar19 == 0x41) {
        (s->hasher_).privat._H65.common = &hasher->common;
        lVar33 = 10;
        pHVar39 = hasher;
        psVar42 = &(s->hasher_).privat._H35.ha_common.dict_num_matches;
        for (lVar59 = lVar33; lVar59 != 0; lVar59 = lVar59 + -1) {
          *psVar42 = (size_t)(pHVar39->common).extra[0];
          pHVar39 = (Hasher *)((long)pHVar39 + (ulong)bVar30 * -0x10 + 8);
          psVar42 = psVar42 + (ulong)bVar30 * -2 + 1;
        }
        pHVar39 = hasher;
        psVar42 = &(s->hasher_).privat._H35.hb_common.dict_num_matches;
        for (; lVar33 != 0; lVar33 = lVar33 + -1) {
          *psVar42 = (size_t)(pHVar39->common).extra[0];
          pHVar39 = (Hasher *)((long)pHVar39 + (ulong)bVar30 * -0x10 + 8);
          psVar42 = psVar42 + (ulong)bVar30 * -2 + 1;
        }
        (s->hasher_).privat._H65.fresh = 1;
        (s->hasher_).privat._H65.params = &s->params;
        params = (BrotliEncoderParams *)hasher;
      }
    }
  }
  (s->hasher_).common.is_prepared_ = 0;
  (s->hasher_).common.is_setup_ = 1;
LAB_00dfb4da:
  local_a18 = &(s->hasher_).common.is_prepared_;
  iVar19 = (s->hasher_).common.params.type;
  uVar32 = (uint)puVar20;
  switch(iVar19) {
  case 2:
    puVar40 = (s->hasher_).privat._H2.buckets_;
    if (uVar32 < 0x801 && (bVar61 && bVar60)) {
      for (puVar41 = (uint32_t *)0x0; puVar20 != puVar41; puVar41 = (uint32_t *)((long)puVar41 + 1))
      {
        puVar40[(ulong)(*(long *)(data + (long)puVar41) * 0x7bd3579bd3000000) >> 0x30] = 0;
      }
    }
    else {
      __n = 0x40000;
LAB_00dfba11:
      switchD_0049f7f1::default(puVar40,0,__n);
    }
    break;
  case 3:
    duckdb_brotli::PrepareH3(&(s->hasher_).privat._H3,uVar48,(size_t)puVar20,data);
    break;
  case 4:
    puVar40 = (s->hasher_).privat._H2.buckets_;
    if (0x1000 < uVar32 || (!bVar61 || !bVar60)) {
      __n = 0x80000;
      goto LAB_00dfba11;
    }
    for (puVar41 = (uint32_t *)0x0; puVar41 != puVar20; puVar41 = (uint32_t *)((long)puVar41 + 1)) {
      lVar33 = *(long *)(data + (long)puVar41);
      for (iVar19 = 0; iVar19 != 0x20; iVar19 = iVar19 + 8) {
        puVar40[(uint)((ulong)(lVar33 * 0x7bd3579bd3000000) >> 0x2f) + iVar19 & 0x1ffff] = 0;
      }
    }
    break;
  case 5:
    uVar35 = (s->hasher_).privat._H5.bucket_size_;
    puVar40 = (uint32_t *)(s->hasher_).privat._H5.num_;
    if ((!bVar61 || !bVar60) || (uint32_t *)(uVar35 >> 6) < puVar20) {
      __n = uVar35 * 2;
      goto LAB_00dfba11;
    }
    for (puVar41 = (uint32_t *)0x0; puVar20 != puVar41; puVar41 = (uint32_t *)((long)puVar41 + 1)) {
      *(undefined2 *)
       ((long)puVar40 +
       (ulong)((uint)(*(int *)(data + (long)puVar41) * 0x1e35a7bd) >>
              (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f)) * 2) = 0;
    }
    break;
  case 6:
    duckdb_brotli::PrepareH6(&(s->hasher_).privat._H6,uVar48,(size_t)puVar20,data);
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    uVar18 = (s->hasher_).privat._H5.hash_shift_;
    puVar40 = (s->hasher_).privat._H2.buckets_;
    for (lVar33 = 0; lVar33 != 0x20000; lVar33 = lVar33 + 1) {
      puVar40[lVar33] = uVar18;
    }
    break;
  default:
    puVar21 = data;
    switch(iVar19) {
    case 0x23:
      if ((s->hasher_).privat._H35.fresh != 0) {
        (s->hasher_).privat._H35.fresh = 0;
        pHVar4 = (s->hasher_).privat._H35.common;
        puVar40 = (uint32_t *)pHVar4->extra[0];
        pHVar44 = &(s->hasher_).privat._H35.ha_common;
        (s->hasher_).privat._H6.buckets_ = puVar40;
        (s->hasher_).privat._H35.ha_common.extra[1] = pHVar4->extra[1];
        (s->hasher_).privat._H35.ha_common.extra[2] = (void *)0x0;
        (s->hasher_).privat._H35.ha_common.extra[3] = (void *)0x0;
        pvVar25 = pHVar4->extra[3];
        (s->hasher_).privat._H35.hb_common.extra[0] = pHVar4->extra[2];
        (s->hasher_).privat._H35.hb_common.extra[1] = pvVar25;
        (s->hasher_).privat._H35.hb_common.extra[2] = (void *)0x0;
        (s->hasher_).privat._H35.hb_common.extra[3] = (void *)0x0;
        (s->hasher_).privat._H2.common = pHVar44;
        (s->hasher_).privat._H2.buckets_ = puVar40;
        duckdb_brotli::InitializeHROLLING_FAST
                  (&(s->hasher_).privat._H35.hb_common,&(s->hasher_).privat._H35.hb,
                   (BrotliEncoderParams *)pHVar44);
      }
      duckdb_brotli::PrepareH3(&(s->hasher_).privat._H3,uVar48,(size_t)puVar20,data);
LAB_00dfb99c:
      duckdb_brotli::PrepareHROLLING_FAST(&(s->hasher_).privat._H35.hb,uVar32,(size_t)data,puVar21);
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
      pvVar25 = (s->hasher_).privat._H40.extra[0];
      if (uVar32 < 0x201 && (bVar61 && bVar60)) {
        for (puVar40 = (uint32_t *)0x0; puVar20 != puVar40;
            puVar40 = (uint32_t *)((long)puVar40 + 1)) {
          uVar35 = (ulong)((uint)(*(int *)(data + (long)puVar40) * 0x1e35a7bd) >> 0x11);
          *(undefined4 *)((long)pvVar25 + uVar35 * 4) = 0xcccccccc;
          *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000) = 0xcccc;
        }
      }
      else {
LAB_00dfb8b2:
        switchD_0049f7f1::default(pvVar25,0xcc,0x20000);
        switchD_0049f7f1::default((void *)((long)pvVar25 + 0x20000),0,0x10000);
      }
      goto LAB_00dfb8e1;
    case 0x29:
      pvVar25 = (s->hasher_).privat._H40.extra[0];
      if (0x200 < uVar32 || (!bVar61 || !bVar60)) goto LAB_00dfb8b2;
      for (puVar40 = (uint32_t *)0x0; puVar20 != puVar40; puVar40 = (uint32_t *)((long)puVar40 + 1))
      {
        uVar35 = (ulong)((uint)(*(int *)(data + (long)puVar40) * 0x1e35a7bd) >> 0x11);
        *(undefined4 *)((long)pvVar25 + uVar35 * 4) = 0xcccccccc;
        *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000) = 0xcccc;
      }
LAB_00dfb8e1:
      switchD_0049f7f1::default((void *)((long)pvVar25 + 0x30000),0,0x10000);
      (s->hasher_).privat._H42.free_slot_idx[0] = 0;
      break;
    case 0x2a:
      pvVar25 = (s->hasher_).privat._H42.extra[0];
      if (uVar32 < 0x201 && (bVar61 && bVar60)) {
        for (puVar40 = (uint32_t *)0x0; puVar20 != puVar40;
            puVar40 = (uint32_t *)((long)puVar40 + 1)) {
          uVar35 = (ulong)((uint)(*(int *)(data + (long)puVar40) * 0x1e35a7bd) >> 0x11);
          *(undefined4 *)((long)pvVar25 + uVar35 * 4) = 0xcccccccc;
          *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000) = 0xcccc;
        }
      }
      else {
        switchD_0049f7f1::default(pvVar25,0xcc,0x20000);
        switchD_0049f7f1::default((void *)((long)pvVar25 + 0x20000),0,0x10000);
      }
      switchD_0049f7f1::default((void *)((long)pvVar25 + 0x30000),0,0x10000);
      switchD_0049f7f1::default(&(s->hasher_).privat,0,0x400);
      break;
    default:
      if (iVar19 == 0x36) {
        duckdb_brotli::PrepareH54(&(s->hasher_).privat._H54,uVar48,(size_t)puVar20,data);
      }
      else {
        if (iVar19 == 0x37) {
          if ((s->hasher_).privat._H35.fresh != 0) {
            (s->hasher_).privat._H35.fresh = 0;
            pHVar4 = (s->hasher_).privat._H35.common;
            puVar40 = (uint32_t *)pHVar4->extra[0];
            pHVar44 = &(s->hasher_).privat._H35.ha_common;
            (s->hasher_).privat._H6.buckets_ = puVar40;
            (s->hasher_).privat._H35.ha_common.extra[1] = pHVar4->extra[1];
            (s->hasher_).privat._H35.ha_common.extra[2] = (void *)0x0;
            (s->hasher_).privat._H35.ha_common.extra[3] = (void *)0x0;
            pvVar25 = pHVar4->extra[3];
            (s->hasher_).privat._H35.hb_common.extra[0] = pHVar4->extra[2];
            (s->hasher_).privat._H35.hb_common.extra[1] = pvVar25;
            (s->hasher_).privat._H35.hb_common.extra[2] = (void *)0x0;
            (s->hasher_).privat._H35.hb_common.extra[3] = (void *)0x0;
            (s->hasher_).privat._H2.common = pHVar44;
            (s->hasher_).privat._H2.buckets_ = puVar40;
            duckdb_brotli::InitializeHROLLING_FAST
                      (&(s->hasher_).privat._H35.hb_common,&(s->hasher_).privat._H35.hb,
                       (BrotliEncoderParams *)pHVar44);
          }
          duckdb_brotli::PrepareH54(&(s->hasher_).privat._H54,uVar48,(size_t)puVar20,data);
          goto LAB_00dfb99c;
        }
        if (iVar19 == 0x41) {
          self = &(s->hasher_).privat;
          if ((s->hasher_).privat._H65.fresh != 0) {
            (s->hasher_).privat._H65.fresh = 0;
            pHVar44 = (s->hasher_).privat._H65.common;
            pvVar25 = pHVar44->extra[1];
            (s->hasher_).privat._H35.ha_common.dict_num_matches = (size_t)pHVar44->extra[0];
            *(void **)&(s->hasher_).privat._H35.ha_common.params = pvVar25;
            *(int *)((long)&(s->hasher_).privat + 0x78) = 0;
            *(int *)((long)&(s->hasher_).privat + 0x7c) = 0;
            *(undefined8 *)&(s->hasher_).privat._H35.ha_common.is_prepared_ = 0;
            pvVar25 = pHVar44->extra[3];
            (s->hasher_).privat._H35.hb_common.dict_num_matches = (size_t)pHVar44->extra[2];
            *(void **)&(s->hasher_).privat._H35.hb_common.params = pvVar25;
            *(int *)((long)&(s->hasher_).privat + 200) = 0;
            *(int *)((long)&(s->hasher_).privat + 0xcc) = 0;
            *(undefined8 *)&(s->hasher_).privat._H35.hb_common.is_prepared_ = 0;
            duckdb_brotli::InitializeH6
                      ((HasherCommon *)&(s->hasher_).privat._H35.ha_common.dict_num_matches,
                       &self->_H6,params);
            (s->hasher_).privat._H65.hb.state = 0;
            (s->hasher_).privat._H35.ha_common.extra[3] = (void *)0x0;
            *(undefined8 *)&(s->hasher_).privat._H35.ha_common.field_0x24 = 0xf1ebf08100010dcd;
            pvVar25 = (void *)(s->hasher_).privat._H35.hb_common.dict_num_matches;
            (s->hasher_).privat._H35.ha_common.extra[2] = pvVar25;
            for (lVar33 = 0; lVar33 != 0x1000000; lVar33 = lVar33 + 1) {
              *(undefined4 *)((long)pvVar25 + lVar33 * 4) = 0xffffffff;
            }
          }
          duckdb_brotli::PrepareH6(&self->_H6,uVar48,(size_t)puVar20,data);
          duckdb_brotli::PrepareHROLLING(&(s->hasher_).privat._H65.hb,uVar32,(size_t)data,puVar21);
        }
      }
    }
  }
  *local_a18 = 1;
LAB_00dfba97:
  iVar19 = (s->hasher_).common.params.type;
  uVar48 = (uint)puVar20;
  local_a60 = s;
  switch(iVar19) {
  case 2:
    if (2 < uVar17 && 6 < uVar48) {
      puVar20 = (s->hasher_).privat._H2.buckets_;
      puVar20[(ulong)(*(long *)(data + (uVar17 - 3 & uVar2)) * 0x7bd3579bd3000000) >> 0x30] =
           uVar17 - 3;
      puVar20[(ulong)(*(long *)(data + (uVar17 - 2 & uVar2)) * 0x7bd3579bd3000000) >> 0x30] =
           uVar17 - 2;
      puVar20[(ulong)(*(long *)(data + (uVar17 - 1 & uVar2)) * 0x7bd3579bd3000000) >> 0x30] =
           uVar17 - 1;
    }
    break;
  case 3:
    if (2 < uVar17 && 6 < uVar48) {
      uVar32 = uVar17 - 3;
      puVar20 = (s->hasher_).privat._H2.buckets_;
      uVar48 = 0xffff;
      puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar32 & uVar2)) * 0x7bd3579bd3000000) >>
                            0x30) + (uVar32 & 8) & 0xffff] = uVar32;
      uVar32 = uVar17 - 2;
      puVar20[(uint)(ushort)((ulong)(*(long *)(data + (uVar32 & uVar2)) * 0x7bd3579bd3000000) >>
                            0x30) + (uVar32 & 8) & 0xffff] = uVar32;
      uVar56 = (uint)(ushort)((ulong)(*(long *)(data + (uVar17 - 1 & uVar2)) * 0x7bd3579bd3000000)
                             >> 0x30);
      uVar32 = uVar17 - 1 & 8;
LAB_00dfc290:
      uVar48 = uVar56 + uVar32 & uVar48;
LAB_00dfc296:
      puVar20[uVar48] = uVar17 - 1;
    }
    break;
  case 4:
    if (2 < uVar17 && 6 < uVar48) {
      uVar32 = uVar17 - 3;
      puVar20 = (s->hasher_).privat._H2.buckets_;
      uVar48 = 0x1ffff;
      puVar20[(uint)((ulong)(*(long *)(data + (uVar32 & uVar2)) * 0x7bd3579bd3000000) >> 0x2f) +
              (uVar32 & 0x18) & 0x1ffff] = uVar32;
      uVar32 = uVar17 - 2;
      puVar20[(uint)((ulong)(*(long *)(data + (uVar32 & uVar2)) * 0x7bd3579bd3000000) >> 0x2f) +
              (uVar32 & 0x18) & 0x1ffff] = uVar32;
      uVar56 = (uint)((ulong)(*(long *)(data + (uVar17 - 1 & uVar2)) * 0x7bd3579bd3000000) >> 0x2f);
      uVar32 = uVar17 - 1 & 0x18;
      goto LAB_00dfc290;
    }
    break;
  case 5:
    if (2 < uVar17 && 2 < uVar48) {
      uVar48 = (uint)(*(int *)(data + (uVar17 - 3 & uVar2)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      puVar5 = (s->hasher_).privat._H5.num_;
      uVar16 = puVar5[uVar48];
      puVar20 = (s->hasher_).privat._H5.buckets_;
      puVar20[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar16) +
              (ulong)(uVar48 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar17 - 3
      ;
      puVar5[uVar48] = uVar16 + 1;
      uVar48 = (uint)(*(int *)(data + (uVar17 - 2 & uVar2)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      uVar16 = puVar5[uVar48];
      puVar20[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar16) +
              (ulong)(uVar48 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar17 - 2
      ;
      puVar5[uVar48] = uVar16 + 1;
      uVar48 = (uint)(*(int *)(data + (uVar17 - 1 & uVar2)) * 0x1e35a7bd) >>
               (*(byte *)((long)&(s->hasher_).privat + 0x10) & 0x1f);
      uVar16 = puVar5[uVar48];
      puVar20[(ulong)((s->hasher_).privat._H5.block_mask_ & (uint)uVar16) +
              (ulong)(uVar48 << (*(byte *)((long)&(s->hasher_).privat + 0x18) & 0x1f))] = uVar17 - 1
      ;
      puVar5[uVar48] = uVar16 + 1;
    }
    break;
  case 6:
    if (2 < uVar17 && 6 < uVar48) {
      puVar40 = (s->hasher_).privat._H5.buckets_;
      puVar20 = (s->hasher_).privat._H6.buckets_;
      uVar54 = (s->hasher_).privat._H6.hash_mul_;
      uVar35 = *(long *)(data + (uVar17 - 3 & uVar2)) * uVar54 >> 0x31;
      uVar16 = *(ushort *)((long)puVar40 + uVar35 * 2);
      uVar48 = (s->hasher_).privat._H6.block_mask_;
      bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
      *(ushort *)((long)puVar40 + uVar35 * 2) = uVar16 + 1;
      puVar20[(uVar35 << (bVar30 & 0x3f)) + (ulong)(uVar48 & uVar16)] = uVar17 - 3;
      uVar35 = *(long *)(data + (uVar17 - 2 & uVar2)) * uVar54 >> 0x31;
      uVar16 = *(ushort *)((long)puVar40 + uVar35 * 2);
      uVar48 = (s->hasher_).privat._H6.block_mask_;
      bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
      *(ushort *)((long)puVar40 + uVar35 * 2) = uVar16 + 1;
      puVar20[(uVar35 << (bVar30 & 0x3f)) + (ulong)(uVar48 & uVar16)] = uVar17 - 2;
      uVar35 = uVar54 * *(long *)(data + (uVar17 - 1 & uVar2)) >> 0x31;
      uVar16 = *(ushort *)((long)puVar40 + uVar35 * 2);
      uVar48 = (s->hasher_).privat._H6.block_mask_ & (uint)uVar16;
      bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
      *(ushort *)((long)puVar40 + uVar35 * 2) = uVar16 + 1;
      puVar20 = puVar20 + (uVar35 << (bVar30 & 0x3f));
      goto LAB_00dfc296;
    }
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    if (0x7f < uVar17 && 2 < uVar48) {
      local_a50 = (uint8_t *)((long)puVar20 + (long)(local_b40 + -0x7f));
      if (local_b40 < (uint8_t *)((long)puVar20 + (long)(local_b40 + -0x7f))) {
        local_a50 = local_b40;
      }
      local_a10 = data + 0x80;
      for (puVar21 = local_b40 + -0x7f; local_a08 = local_b40, puVar21 < local_a50;
          puVar21 = puVar21 + 1) {
        local_a70 = (Command *)(s->hasher_).privat._H5.bucket_size_;
        uVar35 = (long)local_b40 - (long)puVar21;
        if ((ulong)((long)local_b40 - (long)puVar21) < 0x10) {
          uVar35 = 0xf;
        }
        puVar20 = (s->hasher_).privat._H2.buckets_;
        local_a68 = (long)local_a70 - uVar35;
        uVar32 = (uint)puVar21 & uVar2;
        puVar8 = data + uVar32;
        pvVar25 = (s->hasher_).privat._H40.extra[1];
        uVar48 = (uint)(*(int *)(data + uVar32) * 0x1e35a7bd) >> 0xf;
        uVar18 = puVar20[uVar48];
        local_ad8 = ((ulong)local_a70 & (ulong)puVar21) * 2 + 1;
        local_a48 = ((ulong)local_a70 & (ulong)puVar21) * 2;
        puVar20[uVar48] = (uint)puVar21;
        local_a98 = local_a10 + uVar32;
        local_af8 = (uint32_t *)0x0;
        local_ac8 = (uint32_t *)0x0;
        lVar33 = 0x40;
        while (puVar21 != (uint8_t *)(ulong)uVar18) {
          bVar60 = lVar33 == 0;
          lVar33 = lVar33 + -1;
          if ((local_a68 < (ulong)((long)puVar21 - (long)(ulong)uVar18)) || (bVar60)) break;
          puVar20 = local_ac8;
          if (local_af8 < local_ac8) {
            puVar20 = local_af8;
          }
          puVar52 = (ulong *)(data + (uVar18 & uVar2) + (long)puVar20);
          uVar35 = 0x80 - (long)puVar20;
          lVar59 = 0;
          puVar26 = (ulong *)(puVar8 + (long)puVar20);
LAB_00dfc048:
          if (7 < uVar35) {
            if (*puVar52 == *puVar26) goto code_r0x00dfc059;
            uVar23 = *puVar26 ^ *puVar52;
            uVar35 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
              }
            }
            lVar59 = (uVar35 >> 3 & 0x1fffffff) - lVar59;
            goto LAB_00dfc0a0;
          }
          for (uVar23 = 0; puVar27 = local_a98, uVar35 != uVar23; uVar23 = uVar23 + 1) {
            if (*(uint8_t *)((long)puVar26 + uVar23) != *(uint8_t *)((long)puVar52 + uVar23)) {
              puVar27 = (uint8_t *)((long)puVar26 + uVar23);
              break;
            }
          }
          lVar59 = (long)puVar27 - (long)(puVar8 + (long)puVar20);
LAB_00dfc0a0:
          puVar20 = (uint32_t *)((long)puVar20 + lVar59);
          if ((uint32_t *)0x7f < puVar20) {
            *(undefined4 *)((long)pvVar25 + local_a48 * 4) =
                 *(undefined4 *)((long)pvVar25 + (ulong)((uint)local_a70 & uVar18) * 8);
            iVar19 = *(int *)((long)pvVar25 + (ulong)((uint)local_a70 & uVar18) * 8 + 4);
            goto LAB_00dfc154;
          }
          uVar35 = (ulong)(uVar18 & (uint)local_a70) * 2;
          if ((data + (uVar18 & uVar2))[(long)puVar20] < puVar8[(long)puVar20]) {
            *(uint32_t *)((long)pvVar25 + local_a48 * 4) = uVar18;
            uVar35 = uVar35 | 1;
            local_af8 = puVar20;
            local_a48 = uVar35;
          }
          else {
            *(uint32_t *)((long)pvVar25 + local_ad8 * 4) = uVar18;
            local_ad8 = uVar35;
            local_ac8 = puVar20;
          }
          uVar18 = *(uint *)((long)pvVar25 + uVar35 * 4);
        }
        iVar19 = (s->hasher_).privat._H5.hash_shift_;
        *(int *)((long)pvVar25 + local_a48 * 4) = iVar19;
LAB_00dfc154:
        *(int *)((long)pvVar25 + local_ad8 * 4) = iVar19;
      }
    }
    break;
  default:
    switch(iVar19) {
    case 0x23:
      puVar40 = (uint32_t *)CONCAT71(0x10845,uVar17 < 3 || uVar48 < 7);
      if (uVar17 >= 3 && uVar48 >= 7) {
        uVar48 = uVar17 - 3;
        puVar41 = (s->hasher_).privat._H2.buckets_;
        puVar40 = (uint32_t *)0xffff;
        puVar41[(uint)(ushort)((ulong)(*(long *)(data + (uVar48 & uVar2)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar48 & 8) & 0xffff] = uVar48;
        uVar48 = uVar17 - 2;
        puVar41[(uint)(ushort)((ulong)(*(long *)(data + (uVar48 & uVar2)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar48 & 8) & 0xffff] = uVar48;
        uVar48 = uVar17 - 1;
        puVar41[(uint)(ushort)((ulong)(*(long *)(data + (uVar48 & uVar2)) * 0x7bd3579bd3000000) >>
                              0x30) + (uVar48 & 8) & 0xffff] = uVar48;
      }
LAB_00dfc68d:
      puVar21 = local_b40;
      if ((uVar17 & 3) != 0) {
        puVar40 = (uint32_t *)(4 - ((ulong)local_b40 & 3));
        bVar60 = puVar20 < puVar40;
        puVar20 = (uint32_t *)((long)puVar20 - (long)puVar40);
        if (bVar60) {
          puVar20 = (uint32_t *)0x0;
        }
        puVar21 = local_b40 + (long)puVar40;
      }
      uVar35 = (ulong)((uint)puVar21 & uVar2);
      puVar41 = (uint32_t *)(mask - uVar35);
      if (puVar20 < puVar41) {
        puVar41 = puVar20;
      }
      duckdb_brotli::PrepareHROLLING_FAST
                (&(s->hasher_).privat._H35.hb,(int)puVar41,(size_t)(data + uVar35),
                 (uint8_t *)puVar40);
      *(uint8_t **)&(s->hasher_).privat._H65.ha.num_last_distances_to_check_ = puVar21;
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      if (2 < uVar17 && 2 < uVar48) {
        puVar21 = local_b40 + -3;
        pvVar25 = (s->hasher_).privat._H40.extra[0];
        pvVar6 = (s->hasher_).privat._H40.extra[1];
        uVar48 = (uint)(*(int *)(data + ((uint)puVar21 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar35 = (ulong)uVar48;
        uVar16 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar16 + 1;
        uVar23 = (long)puVar21 - (ulong)*(uint *)((long)pvVar25 + uVar35 * 4);
        if (0xfffe < uVar23) {
          uVar23 = 0xffff;
        }
        *(char *)((long)pvVar25 + ((ulong)puVar21 & 0xffff) + 0x30000) = (char)uVar48;
        *(short *)((long)pvVar6 + (ulong)uVar16 * 4) = (short)uVar23;
        *(undefined2 *)((long)pvVar6 + (ulong)uVar16 * 4 + 2) =
             *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000);
        *(uint *)((long)pvVar25 + uVar35 * 4) = (uint)puVar21;
        *(ushort *)((long)pvVar25 + uVar35 * 2 + 0x20000) = uVar16;
        puVar21 = local_b40 + -2;
        pvVar25 = (s->hasher_).privat._H40.extra[0];
        pvVar6 = (s->hasher_).privat._H40.extra[1];
        uVar48 = (uint)(*(int *)(data + ((uint)puVar21 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar35 = (ulong)uVar48;
        uVar16 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar16 + 1;
        uVar23 = (long)puVar21 - (ulong)*(uint *)((long)pvVar25 + uVar35 * 4);
        *(char *)((long)pvVar25 + ((ulong)puVar21 & 0xffff) + 0x30000) = (char)uVar48;
        if (0xfffe < uVar23) {
          uVar23 = 0xffff;
        }
        *(short *)((long)pvVar6 + (ulong)uVar16 * 4) = (short)uVar23;
        *(undefined2 *)((long)pvVar6 + (ulong)uVar16 * 4 + 2) =
             *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000);
        *(uint *)((long)pvVar25 + uVar35 * 4) = (uint)puVar21;
        *(ushort *)((long)pvVar25 + uVar35 * 2 + 0x20000) = uVar16;
        puVar21 = local_b40 + -1;
        pvVar25 = (s->hasher_).privat._H40.extra[0];
        pvVar6 = (s->hasher_).privat._H40.extra[1];
        uVar48 = (uint)(*(int *)(data + ((uint)puVar21 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar35 = (ulong)uVar48;
        uVar16 = (s->hasher_).privat._H42.free_slot_idx[0];
        (s->hasher_).privat._H42.free_slot_idx[0] = uVar16 + 1;
        uVar23 = (long)puVar21 - (ulong)*(uint *)((long)pvVar25 + uVar35 * 4);
        *(char *)((long)pvVar25 + ((ulong)puVar21 & 0xffff) + 0x30000) = (char)uVar48;
        if (0xfffe < uVar23) {
          uVar23 = 0xffff;
        }
        *(short *)((long)pvVar6 + (ulong)uVar16 * 4) = (short)uVar23;
        *(undefined2 *)((long)pvVar6 + (ulong)uVar16 * 4 + 2) =
             *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000);
        *(uint *)((long)pvVar25 + uVar35 * 4) = (uint)puVar21;
        *(ushort *)((long)pvVar25 + uVar35 * 2 + 0x20000) = uVar16;
      }
      break;
    case 0x2a:
      if (2 < uVar17 && 2 < uVar48) {
        puVar21 = local_b40 + -3;
        pvVar25 = (s->hasher_).privat._H42.extra[0];
        uVar32 = (uint)(*(int *)(data + ((uint)puVar21 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar35 = (ulong)uVar32;
        uVar48 = uVar32 & 0x1ff;
        uVar16 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar48 * 2);
        pvVar6 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar48 * 2) = uVar16 + 1;
        uVar23 = (ulong)uVar16 & 0x1ff;
        uVar36 = (long)puVar21 - (ulong)*(uint *)((long)pvVar25 + uVar35 * 4);
        *(char *)((long)pvVar25 + ((ulong)puVar21 & 0xffff) + 0x30000) = (char)uVar32;
        if (0xfffe < uVar36) {
          uVar36 = 0xffff;
        }
        *(short *)((long)pvVar6 + uVar23 * 4 + (ulong)(uVar48 << 0xb)) = (short)uVar36;
        *(undefined2 *)((long)pvVar6 + uVar23 * 4 + (ulong)(uVar48 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000);
        *(uint *)((long)pvVar25 + uVar35 * 4) = (uint)puVar21;
        *(short *)((long)pvVar25 + uVar35 * 2 + 0x20000) = (short)uVar23;
        puVar21 = local_b40 + -2;
        pvVar25 = (s->hasher_).privat._H42.extra[0];
        uVar48 = (uint)(*(int *)(data + ((uint)puVar21 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar35 = (ulong)uVar48;
        uVar32 = uVar48 & 0x1ff;
        uVar16 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar32 * 2);
        pvVar6 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar32 * 2) = uVar16 + 1;
        uVar23 = (ulong)uVar16 & 0x1ff;
        uVar36 = (long)puVar21 - (ulong)*(uint *)((long)pvVar25 + uVar35 * 4);
        *(char *)((long)pvVar25 + ((ulong)puVar21 & 0xffff) + 0x30000) = (char)uVar48;
        if (0xfffe < uVar36) {
          uVar36 = 0xffff;
        }
        *(short *)((long)pvVar6 + uVar23 * 4 + (ulong)(uVar32 << 0xb)) = (short)uVar36;
        *(undefined2 *)((long)pvVar6 + uVar23 * 4 + (ulong)(uVar32 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar25 + uVar35 * 2 + 0x20000);
        *(uint *)((long)pvVar25 + uVar35 * 4) = (uint)puVar21;
        *(short *)((long)pvVar25 + uVar35 * 2 + 0x20000) = (short)uVar23;
        puVar21 = local_b40 + -1;
        pvVar25 = (s->hasher_).privat._H42.extra[0];
        uVar32 = (uint)(*(int *)(data + ((uint)puVar21 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar23 = (ulong)uVar32;
        uVar48 = uVar32 & 0x1ff;
        uVar16 = *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar48 * 2);
        pvVar6 = (s->hasher_).privat._H42.extra[1];
        *(ushort *)((long)(&(s->hasher_).common + 1) + (ulong)uVar48 * 2) = uVar16 + 1;
        uVar36 = (ulong)uVar16 & 0x1ff;
        uVar35 = (long)puVar21 - (ulong)*(uint *)((long)pvVar25 + uVar23 * 4);
        *(char *)((long)pvVar25 + ((ulong)puVar21 & 0xffff) + 0x30000) = (char)uVar32;
        if (0xfffe < uVar35) {
          uVar35 = 0xffff;
        }
        *(short *)((long)pvVar6 + uVar36 * 4 + (ulong)(uVar48 << 0xb)) = (short)uVar35;
        *(undefined2 *)((long)pvVar6 + uVar36 * 4 + (ulong)(uVar48 << 0xb) + 2) =
             *(undefined2 *)((long)pvVar25 + uVar23 * 2 + 0x20000);
        *(uint *)((long)pvVar25 + uVar23 * 4) = (uint)puVar21;
        *(short *)((long)pvVar25 + uVar23 * 2 + 0x20000) = (short)uVar36;
      }
      break;
    default:
      if (iVar19 == 0x36) {
        if (2 < uVar17 && 6 < uVar48) {
          uVar48 = uVar17 - 3;
          puVar20 = (s->hasher_).privat._H2.buckets_;
          puVar20[(uint)((ulong)(*(long *)(data + (uVar48 & uVar2)) * -0x1ca5842ca8642d00) >> 0x2c)
                  + (uVar48 & 0x18) & 0xfffff] = uVar48;
          uVar48 = uVar17 - 2;
          puVar20[(uint)((ulong)(*(long *)(data + (uVar48 & uVar2)) * -0x1ca5842ca8642d00) >> 0x2c)
                  + (uVar48 & 0x18) & 0xfffff] = uVar48;
          uVar48 = uVar17 - 1;
          puVar20[(uint)((ulong)(*(long *)(data + (uVar48 & uVar2)) * -0x1ca5842ca8642d00) >> 0x2c)
                  + (uVar48 & 0x18) & 0xfffff] = uVar48;
        }
      }
      else {
        uVar10 = (undefined3)((uint)iVar19 >> 8);
        if (iVar19 == 0x37) {
          puVar40 = (uint32_t *)(ulong)CONCAT31(uVar10,uVar48 < 7);
          if (2 < uVar17 && uVar48 >= 7) {
            uVar48 = uVar17 - 3;
            puVar40 = (s->hasher_).privat._H2.buckets_;
            puVar40[(uint)((ulong)(*(long *)(data + (uVar48 & uVar2)) * -0x1ca5842ca8642d00) >> 0x2c
                          ) + (uVar48 & 0x18) & 0xfffff] = uVar48;
            uVar48 = uVar17 - 2;
            puVar40[(uint)((ulong)(*(long *)(data + (uVar48 & uVar2)) * -0x1ca5842ca8642d00) >> 0x2c
                          ) + (uVar48 & 0x18) & 0xfffff] = uVar48;
            uVar48 = uVar17 - 1;
            puVar40[(uint)((ulong)(*(long *)(data + (uVar48 & uVar2)) * -0x1ca5842ca8642d00) >> 0x2c
                          ) + (uVar48 & 0x18) & 0xfffff] = uVar48;
          }
          goto LAB_00dfc68d;
        }
        if (iVar19 == 0x41) {
          uVar32 = CONCAT31(uVar10,uVar17 < 3 || uVar48 < 7);
          if (uVar17 >= 3 && uVar48 >= 7) {
            puVar40 = (s->hasher_).privat._H5.buckets_;
            puVar41 = (s->hasher_).privat._H6.buckets_;
            uVar54 = (s->hasher_).privat._H6.hash_mul_;
            uVar35 = *(long *)(data + (uVar17 - 3 & uVar2)) * uVar54 >> 0x31;
            uVar16 = *(ushort *)((long)puVar40 + uVar35 * 2);
            uVar48 = (s->hasher_).privat._H6.block_mask_;
            bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
            *(ushort *)((long)puVar40 + uVar35 * 2) = uVar16 + 1;
            puVar41[(uVar35 << (bVar30 & 0x3f)) + (ulong)(uVar48 & uVar16)] = uVar17 - 3;
            uVar35 = *(long *)(data + (uVar17 - 2 & uVar2)) * uVar54 >> 0x31;
            uVar16 = *(ushort *)((long)puVar40 + uVar35 * 2);
            uVar48 = (s->hasher_).privat._H6.block_mask_;
            bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
            *(ushort *)((long)puVar40 + uVar35 * 2) = uVar16 + 1;
            puVar41[(uVar35 << (bVar30 & 0x3f)) + (ulong)(uVar48 & uVar16)] = uVar17 - 2;
            uVar32 = uVar17 - 1 & uVar2;
            uVar35 = uVar54 * *(long *)(data + uVar32) >> 0x31;
            uVar16 = *(ushort *)((long)puVar40 + uVar35 * 2);
            uVar48 = (s->hasher_).privat._H6.block_mask_;
            bVar30 = *(byte *)((long)&(s->hasher_).privat + 0x1c);
            uVar32 = CONCAT31((int3)(uVar32 >> 8),bVar30);
            *(ushort *)((long)puVar40 + uVar35 * 2) = uVar16 + 1;
            puVar41[(uVar35 << (bVar30 & 0x3f)) + (ulong)(uVar48 & uVar16)] = uVar17 - 1;
          }
          puVar40 = (uint32_t *)(mask - (uVar2 & uVar17));
          if (puVar20 <= puVar40) {
            puVar40 = puVar20;
          }
          duckdb_brotli::PrepareHROLLING
                    (&(s->hasher_).privat._H65.hb,(int)puVar40,(size_t)(data + (uVar2 & uVar17)),
                     (uint8_t *)(ulong)uVar32);
          *(uint8_t **)((long)&(s->hasher_).privat + 0x50) = local_b40;
        }
      }
    }
  }
  psVar42 = &s->num_commands_;
  if ((s->params).quality < 10) {
LAB_00dfc72d:
    local_a48 = 2;
  }
  else {
    uVar54 = s->input_pos_;
    uVar7 = s->last_flush_pos_;
    uVar18 = WrapPosition(uVar7);
    iVar19 = duckdb_brotli::BrotliIsMostlyUTF8(data,(ulong)uVar18,mask,uVar54 - uVar7,0.75);
    if (iVar19 != 0) goto LAB_00dfc72d;
    local_a48 = 3;
  }
  sVar38 = *psVar42;
  s_00 = s;
  if ((sVar38 != 0) && (s_00 = s, s->last_insert_len_ == 0)) {
    pCVar24 = s->commands_;
    uVar36 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar48 = pCVar24[sVar38 - 1].copy_len_;
    uVar58 = (ulong)uVar48;
    uVar23 = (ulong)(uVar48 & 0x1ffffff);
    uVar35 = s->last_processed_pos_ - uVar23;
    if (uVar36 <= uVar35) {
      uVar35 = uVar36;
    }
    iVar19 = s->dist_cache_[0];
    uVar36 = (ulong)iVar19;
    uVar16 = pCVar24[sVar38 - 1].dist_prefix_;
    uVar56 = uVar16 & 0x3ff;
    uVar18 = (s->params).dist.num_direct_distance_codes;
    uVar32 = uVar18 + 0x10;
    local_ac8 = (uint32_t *)CONCAT44(local_ac8._4_4_,(uint)uVar16);
    if (uVar32 <= uVar56) {
      uVar47 = (s->params).dist.distance_postfix_bits;
      bVar30 = (byte)uVar47;
      uVar56 = (uVar56 - uVar18) - 0x10;
      uVar56 = (~(-1 << (bVar30 & 0x1f)) & uVar56) + uVar32 +
               (pCVar24[sVar38 - 1].dist_extra_ +
                (((uVar56 >> (uVar47 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar16 >> 10) & 0x1f)) + -4
               << (bVar30 & 0x1f));
    }
    s_00 = local_a60;
    if (uVar56 - 0xf == uVar36 || uVar56 < 0x10) {
      uVar32 = (local_a60->ringbuffer_).mask_;
      puVar21 = (local_a60->ringbuffer_).buffer_;
      uVar28 = uVar36 - uVar35;
      if (uVar36 < uVar35 || uVar28 == 0) {
        local_ab0._0_4_ = uVar17 + (int)local_ab0;
        uVar35 = local_b38 & 0xffffffff;
        while( true ) {
          uVar48 = (uint)uVar58;
          iVar53 = (int)uVar35;
          uVar35 = (ulong)(iVar53 - 1);
          if (iVar53 == 0) break;
          uVar17 = (uint32_t)local_b40;
          if (puVar21[uVar17 & uVar32] != puVar21[uVar17 - iVar19 & uVar32]) goto LAB_00dfd0af;
          uVar58 = (ulong)(uVar48 + 1);
          pCVar24[sVar38 - 1].copy_len_ = uVar48 + 1;
          local_b40 = (uint8_t *)(ulong)(uVar17 + 1);
          local_b38 = uVar35;
        }
        local_b38 = 0;
        uVar17 = (int)local_ab0 - local_aa8._0_4_;
      }
      else {
        uVar35 = (local_a60->params).dictionary.compound.total_size;
        if ((uVar28 - 1 < uVar35) && (uVar23 < uVar28)) {
          uVar23 = (uVar35 - uVar28) + uVar23;
          sVar51 = 0xffffffffffffffff;
          do {
            sVar50 = sVar51;
            uVar35 = (local_a60->params).dictionary.compound.chunk_offsets[sVar50 + 2];
            sVar51 = sVar50 + 1;
          } while (uVar35 <= uVar23);
          sVar51 = (local_a60->params).dictionary.compound.chunk_offsets[sVar50 + 1];
          lVar59 = uVar23 - sVar51;
          lVar33 = uVar35 - sVar51;
          uVar17 = (uVar17 + (int)local_ab0) - local_aa8._0_4_;
          sVar51 = sVar50 + 1;
          while( true ) {
            iVar19 = (int)local_b38;
            puVar8 = (local_a60->params).dictionary.compound.chunk_source[sVar51];
            lVar57 = 0;
            do {
              iVar53 = (int)lVar57;
              if (iVar19 == iVar53) {
                local_b38 = 0;
                goto LAB_00dfd0a5;
              }
              iVar11 = (int)local_b40;
              if (puVar21[iVar11 + iVar53 & uVar32] != puVar8[lVar57 + lVar59]) {
                uVar17 = iVar11 + iVar53;
                goto LAB_00dfd0a5;
              }
              pCVar24[sVar38 - 1].copy_len_ = (int)uVar58 + iVar53 + 1;
              local_b38 = (ulong)((int)local_b38 - 1);
              lVar57 = lVar57 + 1;
            } while (lVar33 - lVar59 != lVar57);
            if (sVar51 + 1 == (local_a60->params).dictionary.compound.num_chunks) break;
            uVar58 = (uVar58 & 0xffffffff) + lVar57;
            local_b40 = (uint8_t *)(((ulong)local_b40 & 0xffffffff) + lVar57);
            lVar33 = (local_a60->params).dictionary.compound.chunk_offsets[sVar51 + 2] -
                     (local_a60->params).dictionary.compound.chunk_offsets[sVar51 + 1];
            lVar59 = 0;
            sVar51 = sVar51 + 1;
          }
          iVar53 = (int)lVar57;
          uVar17 = iVar11 + iVar53;
LAB_00dfd0a5:
          uVar48 = (int)uVar58 + iVar53;
        }
      }
LAB_00dfd0af:
      uVar32 = pCVar24[sVar38 - 1].insert_len_;
      uVar56 = (uVar48 >> 0x19) + (uVar48 & 0x1ffffff);
      uVar48 = uVar32;
      if (5 < (ulong)uVar32) {
        if (uVar32 < 0x82) {
          uVar35 = (ulong)uVar32 - 2;
          uVar48 = 0x1f;
          uVar32 = (uint)uVar35;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar48 == 0; uVar48 = uVar48 - 1) {
            }
          }
          uVar48 = (int)(uVar35 >> ((char)(uVar48 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar48 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar32 < 0x842) {
          uVar48 = 0x1f;
          if (uVar32 - 0x42 != 0) {
            for (; uVar32 - 0x42 >> uVar48 == 0; uVar48 = uVar48 - 1) {
            }
          }
          uVar48 = (uVar48 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar48 = 0x15;
          if (0x1841 < uVar32) {
            uVar48 = (uint)(ushort)(0x17 - (uVar32 < 0x5842));
          }
        }
      }
      if (uVar56 < 10) {
        uVar32 = uVar56 - 2;
      }
      else if (uVar56 < 0x86) {
        uVar32 = 0x1f;
        uVar47 = (uint)((ulong)uVar56 - 6);
        if (uVar47 != 0) {
          for (; uVar47 >> uVar32 == 0; uVar32 = uVar32 - 1) {
          }
        }
        uVar32 = (int)((ulong)uVar56 - 6 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar32 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar32 = 0x17;
        if (uVar56 < 0x846) {
          uVar32 = 0x1f;
          if (uVar56 - 0x46 != 0) {
            for (; uVar56 - 0x46 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (uVar32 ^ 0xffe0) + 0x2c;
        }
      }
      uVar13 = (ushort)uVar32;
      uVar46 = (uVar13 & 7) + ((ushort)uVar48 & 7) * 8;
      if ((((uVar16 & 0x3ff) == 0) && ((ushort)uVar48 < 8)) && (uVar13 < 0x10)) {
        if (7 < uVar13) {
          uVar46 = uVar46 + 0x40;
        }
      }
      else {
        iVar19 = ((uVar48 & 0xffff) >> 3) * 3 + ((uVar32 & 0xffff) >> 3);
        uVar46 = uVar46 + ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar19 * 0x40 + 0x40;
      }
      pCVar24[sVar38 - 1].cmd_prefix_ = uVar46;
    }
  }
  literal_context_lut = &duckdb_brotli::_kBrotliContextLookupTable + (uint)((int)local_a48 << 9);
  iVar19 = (s_00->params).quality;
  local_b38 = local_b38 & 0xffffffff;
  uVar35 = (ulong)uVar17;
  local_ab0 = s_00->dist_cache_;
  last_insert_len = &s_00->last_insert_len_;
  pCVar24 = s_00->commands_ + sVar38;
  num_literals = &s_00->num_literals_;
  if (iVar19 == 0xb) {
    duckdb_brotli::BrotliCreateHqZopfliBackwardReferences
              (m,local_b38,uVar35,data,mask,literal_context_lut,&s_00->params,hasher,local_ab0,
               last_insert_len,pCVar24,psVar42,num_literals);
  }
  else if (iVar19 == 10) {
    duckdb_brotli::BrotliCreateZopfliBackwardReferences
              (m,local_b38,uVar35,data,mask,literal_context_lut,&s_00->params,hasher,local_ab0,
               last_insert_len,pCVar24,psVar42,num_literals);
  }
  else {
    duckdb_brotli::BrotliCreateBackwardReferences
              (local_b38,uVar35,data,mask,literal_context_lut,&s_00->params,hasher,local_ab0,
               last_insert_len,pCVar24,psVar42,num_literals);
  }
  iVar19 = (s_00->params).lgwin;
  iVar53 = (s_00->params).lgblock;
  if (iVar19 <= iVar53) {
    iVar19 = iVar53;
  }
  cVar31 = '\x17';
  if (iVar19 < 0x17) {
    cVar31 = (char)iVar19;
  }
  uVar35 = 1L << (cVar31 + 1U & 0x3f);
  uVar54 = s_00->input_pos_;
  uVar7 = s_00->last_flush_pos_;
  if ((s_00->params).quality < 4) {
    bVar60 = 0x2ffe < s_00->num_commands_ + s_00->num_literals_;
  }
  else {
    bVar60 = false;
  }
  uVar23 = uVar54 - uVar7;
  if (((force_flush == 0 && (int)local_a78 == 0) && (!bVar60)) &&
     (((1L << ((byte)iVar53 & 0x3f)) + uVar23 <= uVar35 &&
      ((uVar35 = uVar35 >> 3, s_00->num_literals_ < uVar35 && (*psVar42 < uVar35)))))) {
    iVar19 = UpdateLastProcessedPos(s_00);
    if (iVar19 != 0) {
      *local_a18 = 0;
    }
LAB_00dfcbfe:
    *out_size = 0;
    return 1;
  }
  uVar35 = s_00->last_insert_len_;
  if (uVar35 != 0) {
    pCVar24 = s_00->commands_;
    sVar38 = s_00->num_commands_;
    s_00->num_commands_ = sVar38 + 1;
    pCVar24[sVar38].insert_len_ = (uint32_t)uVar35;
    pCVar24[sVar38].copy_len_ = 0x8000000;
    pCVar24[sVar38].dist_extra_ = 0;
    pCVar24[sVar38].dist_prefix_ = 0x10;
    if (uVar35 < 6) {
      uVar36 = uVar35 & 0xffffffff;
    }
    else if (uVar35 < 0x82) {
      uVar48 = 0x1f;
      uVar32 = (uint)(uVar35 - 2);
      if (uVar32 != 0) {
        for (; uVar32 >> uVar48 == 0; uVar48 = uVar48 - 1) {
        }
      }
      uVar36 = (ulong)((int)(uVar35 - 2 >> ((char)(uVar48 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar48 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar35 < 0x842) {
      uVar32 = (uint32_t)uVar35 - 0x42;
      uVar48 = 0x1f;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar48 == 0; uVar48 = uVar48 - 1) {
        }
      }
      uVar36 = (ulong)((uVar48 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar36 = 0x15;
      if (0x1841 < uVar35) {
        uVar36 = (ulong)(ushort)(0x17 - (uVar35 < 0x5842));
      }
    }
    iVar19 = (int)((uVar36 & 0xffff) >> 3) * 3;
    pCVar24[sVar38].cmd_prefix_ =
         ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar19 * 0x40 +
         ((ushort)uVar36 & 7) * 8 + 0x42;
    s_00->num_literals_ = s_00->num_literals_ + uVar35;
    s_00->last_insert_len_ = 0;
  }
  if (uVar54 == uVar7 && (int)local_a78 == 0) goto LAB_00dfcbfe;
  puVar21 = GetBrotliStorage(s_00,(ulong)((uint)uVar23 * 2 + 0x1f7));
  storage_ix_1 = (size_t)s_00->last_bytes_bits_;
  *puVar21 = (uint8_t)s_00->last_bytes_;
  puVar21[1] = *(uint8_t *)((long)&s_00->last_bytes_ + 1);
  uVar54 = s_00->last_flush_pos_;
  local_a98 = (uint8_t *)CONCAT71(local_a98._1_7_,s_00->prev_byte_);
  bVar30 = s_00->prev_byte2_;
  sVar38 = s_00->num_literals_;
  local_a70 = s_00->commands_;
  local_a68 = s_00->num_commands_;
  piVar22 = s_00->saved_dist_cache_;
  uVar17 = WrapPosition(uVar54);
  switchD_00916250::default(&storage_ix,s_00,0x578);
  uVar35 = uVar23 & 0xffffffff;
  pBVar37 = s_00;
  if (uVar35 == 0) {
    *(ulong *)(puVar21 + (storage_ix_1 >> 3)) =
         3L << ((byte)storage_ix_1 & 7) | (ulong)puVar21[storage_ix_1 >> 3];
    storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
    goto LAB_00dfe217;
  }
  uVar36 = (ulong)uVar17;
  if ((uint)uVar23 < 3) {
LAB_00dfcce9:
    uVar12 = *(undefined8 *)(s_00->saved_dist_cache_ + 2);
    *(undefined8 *)local_ab0 = *(undefined8 *)piVar22;
    *(undefined8 *)(local_ab0 + 2) = uVar12;
    duckdb_brotli::BrotliStoreUncompressedMetaBlock
              ((int)local_a78,data,uVar36,mask,uVar35,&storage_ix_1,puVar21);
    goto LAB_00dfe217;
  }
  if ((local_a68 < (uVar35 >> 8) + 2) &&
     (auVar64._0_8_ = (double)CONCAT44(0x43300000,(int)sVar38),
     auVar64._8_4_ = (int)(sVar38 >> 0x20), auVar64._12_4_ = 0x45300000,
     local_a50 = (uint8_t *)(double)uVar35,
     (double)local_a50 * 0.99 <
     (auVar64._8_8_ - 1.9342813113834067e+25) + (auVar64._0_8_ - 4503599627370496.0))) {
    switchD_0049f7f1::default(&table_size,0,0x400);
    uVar23 = (uVar35 + 0xc) / 0xd;
    while (bVar60 = uVar23 != 0, uVar23 = uVar23 - 1, bVar60) {
      piVar45 = (int *)((long)&table_size + (ulong)data[(uint)uVar54 & uVar2] * 4);
      *piVar45 = *piVar45 + 1;
      uVar54 = (uint64_t)((uint)uVar54 + 0xd);
    }
    dVar72 = 0.0;
    uVar58 = 0;
    local_a80 = uVar36;
    local_a40 = uVar35;
    for (uVar23 = 0; uVar35 = local_a40, uVar36 = local_a80, uVar23 < 0x400; uVar23 = uVar23 + 8) {
      uVar35 = (ulong)*(uint *)((long)&table_size + uVar23);
      local_aa8 = (double)uVar35;
      if (uVar35 < 0x100) {
        dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
      }
      else {
        dVar62 = log2(local_aa8);
      }
      uVar36 = (ulong)*(uint *)((long)&table_size + uVar23 + 4);
      puVar20 = (uint32_t *)(double)uVar36;
      if (uVar36 < 0x100) {
        dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar36 * 8);
      }
      else {
        local_ac8 = puVar20;
        dVar63 = log2((double)puVar20);
        puVar20 = local_ac8;
      }
      uVar58 = uVar58 + uVar35 + uVar36;
      dVar72 = (dVar72 - local_aa8 * dVar62) - (double)puVar20 * dVar63;
    }
    local_a50 = (uint8_t *)(((double)local_a50 * 7.92) / 13.0);
    auVar65._8_4_ = (int)(uVar58 >> 0x20);
    auVar65._0_8_ = uVar58;
    auVar65._12_4_ = 0x45300000;
    dVar63 = auVar65._8_8_ - 1.9342813113834067e+25;
    dVar62 = dVar63 + ((double)CONCAT44(0x43300000,(int)uVar58) - 4503599627370496.0);
    if (uVar58 != 0) {
      if (uVar58 < 0x100) {
        dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar58 * 8);
      }
      else {
        local_aa8 = dVar62;
        dStack_aa0 = dVar63;
        dVar63 = log2(dVar62);
        dVar62 = local_aa8;
      }
      dVar72 = dVar72 + dVar63 * dVar62;
    }
    if (dVar62 <= dVar72) {
      dVar62 = dVar72;
    }
    if ((double)local_a50 < dVar62) goto LAB_00dfcce9;
  }
  local_a10 = (uint8_t *)CONCAT71(local_a10._1_7_,*puVar21);
  local_a08 = (uint8_t *)CONCAT71(local_a08._1_7_,puVar21[1]);
  local_a50 = (uint8_t *)(storage_ix_1 & 0xff);
  iVar19 = (s_00->params).quality;
  if (iVar19 < 3) {
    duckdb_brotli::BrotliStoreMetaBlockFast
              (m,data,uVar36,uVar35,mask,(int)local_a78,&s_00->params,local_a70,local_a68,
               &storage_ix_1,puVar21);
  }
  else if (iVar19 == 3) {
    duckdb_brotli::BrotliStoreMetaBlockTrivial
              (m,data,uVar36,uVar35,mask,(int)local_a78,&s_00->params,local_a70,local_a68,
               &storage_ix_1,puVar21);
  }
  else {
    duckdb_brotli::BrotliInitBlockSplit((BlockSplit *)&table_size);
    duckdb_brotli::BrotliInitBlockSplit(&local_408);
    duckdb_brotli::BrotliInitBlockSplit(&local_3d8);
    local_368 = (HistogramDistance *)0x0;
    sStack_360 = 0;
    local_378 = (HistogramCommand *)0x0;
    sStack_370 = 0;
    local_388 = (HistogramLiteral *)0x0;
    sStack_380 = 0;
    local_398 = (uint32_t *)0x0;
    sStack_390 = 0;
    local_3a8 = (uint32_t *)0x0;
    sStack_3a0 = 0;
    local_9d0 = (ulong)bVar30;
    local_a2c = (uint)(byte)local_a98;
    local_a40 = uVar35;
    if ((s_00->params).quality < 10) {
      if ((s_00->params).disable_literal_context_modeling == 0) {
        puVar20 = (uint32_t *)duckdb_brotli::BrotliAllocate(m,0x700);
        local_9fc = (s_00->params).quality;
        combined_histo = puVar20;
        if ((uint)uVar35 < 0x40 || local_9fc < 5) {
          local_a38 = 1;
          local_ab8 = (uint32_t *)0x0;
        }
        else {
          end_pos = uVar36 + uVar35;
          local_a80 = uVar36;
          if (0xfffff < (s_00->params).size_hint) {
            local_a38 = 0xd;
            switchD_0049f7f1::default(puVar20,0,0x700);
            local_9c0 = 0.0;
            for (; uVar36 + 0x40 <= end_pos; uVar36 = uVar36 + 0x1000) {
              uVar48 = (uint)uVar36;
              bVar30 = data[uVar48 + 1 & uVar2];
              uVar35 = (ulong)data[uVar48 & uVar2];
              for (lVar33 = 2; uVar23 = (ulong)bVar30, lVar33 != 0x40; lVar33 = lVar33 + 1) {
                bVar30 = data[uVar48 + (int)lVar33 & uVar2];
                uVar32 = *(uint *)(ShouldUseComplexStaticContextMap(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                                   ::kStaticContextMapComplexUTF8 +
                                  (ulong)(byte)((&DAT_010d7920)[uVar35] | (&DAT_010d7820)[uVar23]) *
                                  4);
                puVar20[(uint)(bVar30 >> 3)] = puVar20[(uint)(bVar30 >> 3)] + 1;
                puVar20[(ulong)((uVar32 & 0xff) << 5 | (uint)(bVar30 >> 3)) + 0x20] =
                     puVar20[(ulong)((uVar32 & 0xff) << 5 | (uint)(bVar30 >> 3)) + 0x20] + 1;
                uVar35 = uVar23;
              }
              local_9c0 = local_9c0 + 62.0;
            }
            local_ab8 = (uint32_t *)
                        ShouldUseComplexStaticContextMap(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                        ::kStaticContextMapComplexUTF8;
            local_a98 = (uint8_t *)0x0;
            uStack_a90 = 0;
            uVar23 = 0;
            for (uVar35 = 0; uVar35 < 0x80; uVar35 = uVar35 + 8) {
              uVar36 = (ulong)*(uint *)((long)puVar20 + uVar35);
              if (uVar36 < 0x100) {
                dVar72 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar36 * 8);
              }
              else {
                dVar72 = log2((double)uVar36);
              }
              uVar58 = (ulong)*(uint *)((long)puVar20 + uVar35 + 4);
              if (uVar58 < 0x100) {
                dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar58 * 8);
              }
              else {
                local_aa8 = dVar72;
                dVar62 = log2((double)uVar58);
                dVar72 = local_aa8;
              }
              uVar23 = uVar23 + uVar36 + uVar58;
              local_a98 = (uint8_t *)
                          (((double)local_a98 - (double)uVar36 * dVar72) - (double)uVar58 * dVar62);
            }
            if (uVar23 != 0) {
              auVar66._8_4_ = (int)(uVar23 >> 0x20);
              auVar66._0_8_ = uVar23;
              auVar66._12_4_ = 0x45300000;
              dVar72 = (auVar66._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
              if (uVar23 < 0x100) {
                dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
              }
              else {
                dVar62 = log2(dVar72);
              }
              local_a98 = (uint8_t *)((double)local_a98 + dVar72 * dVar62);
            }
            puVar20 = combined_histo + 0x21;
            local_b30 = 0.0;
            for (lVar33 = 0; lVar33 != 0xd; lVar33 = lVar33 + 1) {
              dVar72 = 0.0;
              uVar35 = 0;
              for (uVar23 = 0; uVar23 < 0x80; uVar23 = uVar23 + 8) {
                uVar36 = (ulong)*(uint *)((long)puVar20 + (uVar23 - 4));
                local_aa8 = (double)uVar36;
                if (uVar36 < 0x100) {
                  dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar36 * 8);
                }
                else {
                  dVar62 = log2(local_aa8);
                }
                uVar58 = (ulong)*(uint *)((long)puVar20 + uVar23);
                puVar40 = (uint32_t *)(double)uVar58;
                if (uVar58 < 0x100) {
                  dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar58 * 8);
                }
                else {
                  local_ac8 = puVar40;
                  dVar63 = log2((double)puVar40);
                  puVar40 = local_ac8;
                }
                uVar35 = uVar35 + uVar36 + uVar58;
                dVar72 = (dVar72 - local_aa8 * dVar62) - (double)puVar40 * dVar63;
              }
              if (uVar35 != 0) {
                auVar67._8_4_ = (int)(uVar35 >> 0x20);
                auVar67._0_8_ = uVar35;
                auVar67._12_4_ = 0x45300000;
                dVar63 = auVar67._8_8_ - 1.9342813113834067e+25;
                dVar62 = dVar63 + ((double)CONCAT44(0x43300000,(int)uVar35) - 4503599627370496.0);
                if (uVar35 < 0x100) {
                  dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
                }
                else {
                  local_aa8 = dVar62;
                  dStack_aa0 = dVar63;
                  dVar63 = log2(dVar62);
                  dVar62 = local_aa8;
                }
                dVar72 = dVar72 + dVar62 * dVar63;
              }
              local_b30 = local_b30 + dVar72;
              puVar20 = puVar20 + 0x20;
            }
            local_b30 = local_b30 * (1.0 / local_9c0);
            if ((local_b30 <= 3.0) &&
               (uVar36 = local_a80, pBVar37 = local_a60, uVar35 = local_a40,
               0.2 <= (1.0 / local_9c0) * (double)local_a98 - local_b30)) goto LAB_00dfdfe3;
          }
          local_a38 = 3;
          combined_histo[4] = 0;
          combined_histo[5] = 0;
          combined_histo[6] = 0;
          combined_histo[7] = 0;
          combined_histo[8] = 0;
          combined_histo[0] = 0;
          combined_histo[1] = 0;
          combined_histo[2] = 0;
          combined_histo[3] = 0;
          for (uVar35 = local_a80; uVar35 + 0x40 <= end_pos; uVar35 = uVar35 + 0x1000) {
            piVar45 = (int *)(DecideOverLiteralContextModeling(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                              ::lut + (ulong)(data[(uint)uVar35 & uVar2] >> 6) * 4);
            for (lVar33 = 1; lVar33 != 0x40; lVar33 = lVar33 + 1) {
              iVar19 = *piVar45;
              piVar45 = (int *)(DecideOverLiteralContextModeling(unsigned_char_const*,unsigned_long,unsigned_long,unsigned_long,int,unsigned_long,unsigned_long*,unsigned_int_const**,unsigned_int*)
                                ::lut + (ulong)(data[uVar2 & (uint)uVar35 + (int)lVar33] >> 6) * 4);
              combined_histo[(long)*piVar45 + (long)iVar19 * 3] =
                   combined_histo[(long)*piVar45 + (long)iVar19 * 3] + 1;
            }
          }
          puVar20 = monogram_histo;
          monogram_histo[2] = 0;
          monogram_histo[0] = 0;
          monogram_histo[1] = 0;
          local_9f8[0] = 0;
          local_9f8[1] = 0;
          local_9f8[2] = 0;
          local_9f8[3] = 0;
          local_9f8[4] = 0;
          local_9f8[5] = 0;
          for (uVar35 = 0; uVar35 != 9; uVar35 = uVar35 + 1) {
            uVar17 = combined_histo[uVar35];
            puVar20[(uVar35 / 3) * -3] = puVar20[(uVar35 / 3) * -3] + uVar17;
            uVar23 = uVar35;
            if (5 < uVar35) {
              uVar23 = uVar35 - 6;
            }
            local_9f8[uVar23] = local_9f8[uVar23] + uVar17;
            puVar20 = puVar20 + 1;
          }
          bVar60 = true;
          puVar29 = monogram_histo;
          dVar72 = 0.0;
          lVar33 = 0;
          puVar55 = monogram_histo + 1;
          while( true ) {
            uVar35 = (ulong)*puVar29;
            if (uVar35 < 0x100) {
              dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
            }
            else {
              dVar62 = log2((double)uVar35);
            }
            uVar23 = lVar33 + uVar35;
            local_af8 = (uint32_t *)(dVar72 - (double)uVar35 * dVar62);
            if (!bVar60) break;
            uVar35 = (ulong)*puVar55;
            if (uVar35 < 0x100) {
              dVar72 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
            }
            else {
              dVar72 = log2((double)uVar35);
            }
            lVar33 = uVar23 + uVar35;
            dVar72 = (double)local_af8 - (double)uVar35 * dVar72;
            bVar60 = false;
            puVar29 = monogram_histo + 2;
            puVar55 = &local_a1c;
          }
          if (uVar23 != 0) {
            auVar68._8_4_ = (int)(uVar23 >> 0x20);
            auVar68._0_8_ = uVar23;
            auVar68._12_4_ = 0x45300000;
            dVar72 = (auVar68._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
            if (uVar23 < 0x100) {
              dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
            }
            else {
              dVar62 = log2(dVar72);
            }
            local_af8 = (uint32_t *)((double)local_af8 + dVar72 * dVar62);
          }
          bVar60 = true;
          local_ac8 = (uint32_t *)0x0;
          uStack_ac0 = 0;
          lVar33 = 0;
          puVar29 = local_9f8;
          puVar55 = local_9f8 + 1;
          while( true ) {
            uVar35 = (ulong)*puVar29;
            if (uVar35 < 0x100) {
              dVar72 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
            }
            else {
              dVar72 = log2((double)uVar35);
            }
            uVar23 = lVar33 + uVar35;
            local_ac8 = (uint32_t *)((double)local_ac8 - (double)uVar35 * dVar72);
            if (!bVar60) break;
            uVar35 = (ulong)*puVar55;
            if (uVar35 < 0x100) {
              dVar72 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
            }
            else {
              dVar72 = log2((double)uVar35);
            }
            lVar33 = uVar23 + uVar35;
            local_ac8 = (uint32_t *)((double)local_ac8 - (double)uVar35 * dVar72);
            bVar60 = false;
            puVar29 = local_9f8 + 2;
            puVar55 = local_9f8 + 3;
          }
          if (uVar23 != 0) {
            auVar69._8_4_ = (int)(uVar23 >> 0x20);
            auVar69._0_8_ = uVar23;
            auVar69._12_4_ = 0x45300000;
            dVar72 = (auVar69._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
            if (uVar23 < 0x100) {
              dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
            }
            else {
              dVar62 = log2(dVar72);
            }
            local_ac8 = (uint32_t *)((double)local_ac8 + dVar72 * dVar62);
          }
          uVar35 = 0xc;
          local_a98 = (uint8_t *)0x0;
          uStack_a90 = 0;
          lVar33 = 0;
          while( true ) {
            uVar23 = (ulong)*(uint *)((long)local_9f8 + uVar35);
            if (uVar23 < 0x100) {
              dVar72 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
            }
            else {
              dVar72 = log2((double)uVar23);
            }
            uVar36 = lVar33 + uVar23;
            local_a98 = (uint8_t *)((double)local_a98 - (double)uVar23 * dVar72);
            if (0x13 < uVar35) break;
            uVar23 = (ulong)*(uint *)((long)local_9f8 + uVar35 + 4);
            if (uVar23 < 0x100) {
              dVar72 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
            }
            else {
              dVar72 = log2((double)uVar23);
            }
            lVar33 = uVar36 + uVar23;
            local_a98 = (uint8_t *)((double)local_a98 - (double)uVar23 * dVar72);
            uVar35 = uVar35 + 8;
          }
          if (uVar36 != 0) {
            auVar70._8_4_ = (int)(uVar36 >> 0x20);
            auVar70._0_8_ = uVar36;
            auVar70._12_4_ = 0x45300000;
            dVar72 = (auVar70._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar36) - 4503599627370496.0);
            if (uVar36 < 0x100) {
              dVar62 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar36 * 8);
            }
            else {
              dVar62 = log2(dVar72);
            }
            local_a98 = (uint8_t *)((double)local_a98 + dVar72 * dVar62);
          }
          local_b30 = 0.0;
          lVar33 = 0;
          puVar20 = combined_histo;
          while (lVar33 != 3) {
            bVar60 = true;
            dVar72 = 0.0;
            lVar59 = 0;
            uVar35 = 0;
            local_ab8 = (uint32_t *)lVar33;
            while( true ) {
              uVar23 = (ulong)*(uint *)((long)puVar20 + uVar35 + lVar33 * 0xc);
              dVar62 = (double)uVar23;
              if (uVar23 < 0x100) {
                dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
              }
              else {
                local_aa8 = dVar62;
                dVar63 = log2(dVar62);
                dVar62 = local_aa8;
              }
              puVar40 = combined_histo;
              uVar23 = lVar59 + uVar23;
              dVar72 = dVar72 - dVar62 * dVar63;
              if (!bVar60) break;
              uVar35 = (ulong)*(uint *)((long)puVar20 + (uVar35 | 4) + lVar33 * 0xc);
              dVar62 = (double)uVar35;
              if (uVar35 < 0x100) {
                dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar35 * 8);
              }
              else {
                local_aa8 = dVar62;
                dVar63 = log2(dVar62);
                dVar62 = local_aa8;
              }
              lVar59 = uVar23 + uVar35;
              dVar72 = dVar72 - dVar62 * dVar63;
              bVar60 = false;
              uVar35 = 8;
            }
            if (uVar23 != 0) {
              auVar71._8_4_ = (int)(uVar23 >> 0x20);
              auVar71._0_8_ = uVar23;
              auVar71._12_4_ = 0x45300000;
              dVar63 = auVar71._8_8_ - 1.9342813113834067e+25;
              dVar62 = dVar63 + ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
              if (uVar23 < 0x100) {
                dVar63 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar23 * 8);
              }
              else {
                local_aa8 = dVar62;
                dStack_aa0 = dVar63;
                dVar63 = log2(dVar62);
                dVar62 = local_aa8;
              }
              dVar72 = dVar72 + dVar62 * dVar63;
            }
            local_b30 = local_b30 + dVar72;
            puVar20 = puVar40;
            lVar33 = (long)local_ab8 + 1;
          }
          dVar72 = 1.0 / (double)(monogram_histo[1] + monogram_histo[0] + monogram_histo[2]);
          dVar62 = (double)local_af8 * dVar72;
          dVar63 = ((double)local_ac8 + (double)local_a98) * dVar72;
          if (local_9fc < 7) {
            local_b30 = dVar62 * 10.0;
          }
          else {
            local_b30 = local_b30 * dVar72;
          }
          uVar36 = local_a80;
          uVar35 = local_a40;
          pBVar37 = local_a60;
          if ((0.2 <= dVar62 - dVar63) || (0.2 <= dVar62 - local_b30)) {
            if (dVar63 - local_b30 < 0.02) {
              local_ab8 = (uint32_t *)
                          ChooseContextMap(int,unsigned_int*,unsigned_long*,unsigned_int_const**)::
                          kStaticContextMapSimpleUTF8;
              local_a38 = 2;
            }
            else {
              local_ab8 = (uint32_t *)
                          ChooseContextMap(int,unsigned_int*,unsigned_long*,unsigned_int_const**)::
                          kStaticContextMapContinuation;
            }
          }
          else {
            local_ab8 = (uint32_t *)0x0;
            local_a38 = 1;
          }
        }
LAB_00dfdfe3:
        duckdb_brotli::BrotliFree(m,combined_histo);
        bVar30 = (byte)local_9d0;
        bVar49 = (byte)local_a2c;
        puVar20 = local_ab8;
      }
      else {
        puVar20 = (uint32_t *)0x0;
        bVar49 = (byte)local_a98;
      }
      duckdb_brotli::BrotliBuildMetaBlockGreedy
                (m,data,uVar36,mask,bVar49,bVar30,literal_context_lut,local_a38,puVar20,local_a70,
                 local_a68,(MetaBlockSplit *)&table_size);
    }
    else {
      duckdb_brotli::BrotliBuildMetaBlock
                (m,data,uVar36,mask,(BrotliEncoderParams *)&storage_ix,(byte)local_a98,bVar30,
                 local_a70,local_a68,(ContextType)local_a48,(MetaBlockSplit *)&table_size);
    }
    local_a80 = uVar36;
    if (3 < (pBVar37->params).quality) {
      duckdb_brotli::BrotliOptimizeHistograms(local_974,(MetaBlockSplit *)&table_size);
    }
    duckdb_brotli::BrotliStoreMetaBlock
              (m,data,local_a80,uVar35,mask,(uint8_t)local_a2c,(uint8_t)local_9d0,(int)local_a78,
               (BrotliEncoderParams *)&storage_ix,(ContextType)local_a48,local_a70,local_a68,
               (MetaBlockSplit *)&table_size,&storage_ix_1,puVar21);
    duckdb_brotli::BrotliDestroyBlockSplit(m,(BlockSplit *)&table_size);
    duckdb_brotli::BrotliDestroyBlockSplit(m,&local_408);
    duckdb_brotli::BrotliDestroyBlockSplit(m,&local_3d8);
    duckdb_brotli::BrotliFree(m,local_3a8);
    local_3a8 = (uint32_t *)0x0;
    duckdb_brotli::BrotliFree(m,local_398);
    local_398 = (uint32_t *)0x0;
    duckdb_brotli::BrotliFree(m,local_388);
    local_388 = (HistogramLiteral *)0x0;
    duckdb_brotli::BrotliFree(m,local_378);
    uVar35 = local_a40;
    uVar36 = local_a80;
    local_378 = (HistogramCommand *)0x0;
    duckdb_brotli::BrotliFree(m,local_368);
  }
  if (uVar35 + 4 < storage_ix_1 >> 3) {
    uVar12 = *(undefined8 *)(s_00->saved_dist_cache_ + 2);
    *(undefined8 *)local_ab0 = *(undefined8 *)piVar22;
    *(undefined8 *)(local_ab0 + 2) = uVar12;
    *puVar21 = (uint8_t)local_a10;
    puVar21[1] = (uint8_t)local_a08;
    storage_ix_1 = (size_t)local_a50;
    duckdb_brotli::BrotliStoreUncompressedMetaBlock
              ((int)local_a78,data,uVar36,mask,uVar35,&storage_ix_1,puVar21);
  }
LAB_00dfe217:
  uVar35 = storage_ix_1 >> 3;
  pBVar37->last_bytes_ = (ushort)puVar21[uVar35];
  pBVar37->last_bytes_bits_ = (byte)storage_ix_1 & 7;
  pBVar37->last_flush_pos_ = pBVar37->input_pos_;
  iVar19 = UpdateLastProcessedPos(pBVar37);
  if (iVar19 != 0) {
    *local_a18 = 0;
  }
  uVar54 = pBVar37->last_flush_pos_;
  if (uVar54 != 0) {
    pBVar37->prev_byte_ = data[uVar2 & (int)uVar54 - 1U];
    if (uVar54 != 1) {
      pBVar37->prev_byte2_ = data[uVar2 & (int)uVar54 - 2U];
    }
  }
  *psVar42 = 0;
  s->num_literals_ = 0;
  uVar12 = *(undefined8 *)(local_ab0 + 2);
  *(undefined8 *)piVar22 = *(undefined8 *)local_ab0;
  *(undefined8 *)(s_00->saved_dist_cache_ + 2) = uVar12;
  *local_9c8 = puVar21;
  *out_size = uVar35;
  return 1;
code_r0x00dfc059:
  puVar52 = puVar52 + 1;
  puVar26 = puVar26 + 1;
  uVar35 = uVar35 - 8;
  lVar59 = lVar59 + -8;
  goto LAB_00dfc048;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;
  BROTLI_BOOL fast_compress =
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  if (delta == 0) {  /* No new input; still might want to flush or finish. */
    if (!data) {  /* No input has been processed so far. */
      if (is_last) {  /* Emit complete finalized stream. */
        BROTLI_DCHECK(s->last_bytes_bits_ <= 14);
        s->last_bytes_ |= (uint16_t)(3u << s->last_bytes_bits_);
        s->last_bytes_bits_ = (uint8_t)(s->last_bytes_bits_ + 2u);
        s->tiny_buf_.u8[0] = (uint8_t)s->last_bytes_;
        s->tiny_buf_.u8[1] = (uint8_t)(s->last_bytes_ >> 8);
        *output = s->tiny_buf_.u8;
        *out_size = (s->last_bytes_bits_ + 7u) >> 3u;
        return BROTLI_TRUE;
      } else {  /* No data, not last -> no-op. */
        *out_size = 0;
        return BROTLI_TRUE;
      }
    } else {
      /* Fast compress performs flush every block -> flush is no-op. */
      if (!is_last && (!force_flush || fast_compress)) {  /* Another no-op. */
        *out_size = 0;
        return BROTLI_TRUE;
      }
    }
  }
  BROTLI_DCHECK(data);

  if (s->params.quality > s->params.dictionary.max_quality) return BROTLI_FALSE;
  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (fast_compress) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          s->one_pass_arena_, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          s->two_pass_arena_, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO(eustas): Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}